

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

double __thiscall p2t::Sweep::HoleAngle(Sweep *this,Node *node)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double by;
  double bx;
  double ay;
  double ax;
  Node *node_local;
  Sweep *this_local;
  
  dVar1 = node->next->point->x - node->point->x;
  dVar2 = node->next->point->y - node->point->y;
  dVar3 = node->prev->point->x - node->point->x;
  dVar4 = node->prev->point->y - node->point->y;
  dVar1 = atan2(dVar1 * dVar4 + -(dVar2 * dVar3),dVar1 * dVar3 + dVar2 * dVar4);
  return dVar1;
}

Assistant:

double Sweep::HoleAngle(const Node& node) const
{
  /* Complex plane
   * ab = cosA +i*sinA
   * ab = (ax + ay*i)(bx + by*i) = (ax*bx + ay*by) + i(ax*by-ay*bx)
   * atan2(y,x) computes the principal value of the argument function
   * applied to the complex number x+iy
   * Where x = ax*bx + ay*by
   *       y = ax*by - ay*bx
   */
  const double ax = node.next->point->x - node.point->x;
  const double ay = node.next->point->y - node.point->y;
  const double bx = node.prev->point->x - node.point->x;
  const double by = node.prev->point->y - node.point->y;
  return atan2(ax * by - ay * bx, ax * bx + ay * by);
}